

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter_range.cpp
# Opt level: O0

int reducer(int state,Action action)

{
  undefined4 uStack_14;
  int state_local;
  Action action_local;
  
  uStack_14 = action.type;
  state_local = action.range;
  if (uStack_14 == INCREMENT) {
    action_local.type = state + state_local;
  }
  else {
    action_local.type = state;
    if (uStack_14 == DECREMENT) {
      action_local.type = state - state_local;
    }
  }
  return action_local.type;
}

Assistant:

int reducer(int state, Action action) {
	switch(action.type) {
		case INCREMENT:
			return state + action.range;

		case DECREMENT:
			return state - action.range;

		default:
			return state;
	}
}